

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O3

QPDFObjectHandle __thiscall
QPDFPageObjectHelper::getFormXObjectForPage(QPDFPageObjectHelper *this,bool handle_transformations)

{
  pointer pcVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  bool bVar3;
  StreamDataProvider *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  char in_DL;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined7 in_register_00000031;
  QPDFPageObjectHelper *this_04;
  QPDFObjectHandle QVar5;
  QPDFObjectHandle bbox;
  QPDFObjectHandle rotate_obj;
  QPDFObjectHandle newdict;
  QPDFObjectHandle scale_obj;
  undefined1 local_e8 [32];
  undefined1 local_c8 [56];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  QPDFPageObjectHelper local_88;
  QPDFObjectHandle local_50;
  QPDFObjectHandle local_40;
  
  this_04 = (QPDFPageObjectHelper *)CONCAT71(in_register_00000031,handle_transformations);
  local_e8._0_8_ =
       (this_04->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_e8._8_8_ =
       (this_04->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count + 1;
    }
  }
  pcVar1 = local_c8 + 0x10;
  local_c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,
             "QPDFPageObjectHelper::getFormXObjectForPage called with a direct object","");
  QPDFObjectHandle::getQPDF((QPDFObjectHandle *)local_e8,(string *)local_c8);
  QPDF::newStream((QPDF *)this);
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
  }
  local_88.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  QPDFObjectHandle::getDict
            ((QPDFObjectHandle *)
             &local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"/Type","");
  peVar2 = (element_type *)(local_e8 + 0x10);
  local_e8._0_8_ = peVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"/XObject","");
  QPDFObjectHandle::newName((QPDFObjectHandle *)(local_c8 + 0x30),(string *)local_e8);
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)
             &local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (string *)local_c8,(QPDFObjectHandle *)(local_c8 + 0x30));
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if ((element_type *)local_e8._0_8_ != peVar2) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  local_c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"/Subtype","");
  local_e8._0_8_ = peVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"/Form","");
  QPDFObjectHandle::newName((QPDFObjectHandle *)(local_c8 + 0x30),(string *)local_e8);
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)
             &local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (string *)local_c8,(QPDFObjectHandle *)(local_c8 + 0x30));
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if ((element_type *)local_e8._0_8_ != peVar2) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  local_c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"/Resources","");
  local_e8._0_8_ = peVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"/Resources","");
  getAttribute(&local_88,(string *)this_04,SUB81(local_e8,0));
  QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)(local_c8 + 0x30));
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)
             &local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (string *)local_c8,(QPDFObjectHandle *)(local_c8 + 0x30));
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if ((element_type *)local_e8._0_8_ != peVar2) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  local_c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"/Group","");
  local_e8._0_8_ = peVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"/Group","");
  getAttribute(&local_88,(string *)this_04,SUB81(local_e8,0));
  QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)(local_c8 + 0x30));
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)
             &local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (string *)local_c8,(QPDFObjectHandle *)(local_c8 + 0x30));
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if ((element_type *)local_e8._0_8_ != peVar2) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  getTrimBox((QPDFPageObjectHelper *)local_c8,handle_transformations,false);
  QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)(local_c8 + 0x30));
  if ((element_type *)local_c8._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
  }
  bVar3 = QPDFObjectHandle::isRectangle((QPDFObjectHandle *)(local_c8 + 0x30));
  if (!bVar3) {
    local_e8._0_8_ =
         (this_04->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_e8._8_8_ =
         (this_04->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count + 1;
      }
    }
    local_c8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c8,
               "bounding box is invalid; form XObject created from page will not work","");
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_e8,(string *)local_c8);
    if ((pointer)local_c8._0_8_ != pcVar1) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
    }
  }
  local_c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"/BBox","");
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)
             &local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (string *)local_c8,(QPDFObjectHandle *)(local_c8 + 0x30));
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  this_02 = (StreamDataProvider *)operator_new(0x20);
  peVar2 = (this_04->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this_04->super_QPDFObjectHelper).super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  QPDFObjectHandle::StreamDataProvider::StreamDataProvider(this_02,false);
  this_02->_vptr_StreamDataProvider = (_func_int **)&PTR__ContentProvider_002edf50;
  this_02[1]._vptr_StreamDataProvider = (_func_int **)peVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this_02[1].supports_retry = this_00;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this_03->_M_use_count = 1;
  this_03->_M_weak_count = 1;
  this_03->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_002ee048;
  this_03[1]._vptr__Sp_counted_base = (_func_int **)this_02;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  this_01._M_pi =
       local_88.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_03->_M_use_count = this_03->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_03->_M_use_count = this_03->_M_use_count + 1;
  }
  local_88.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_02;
  local_88.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = this_03;
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceStreamData
            ((QPDFObjectHandle *)this_01._M_pi,
             (shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&local_88.m,
             (QPDFObjectHandle *)local_c8,(QPDFObjectHandle *)local_e8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
  }
  if ((element_type *)local_c8._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
  }
  if (local_88.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.m.
               super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"/Rotate","");
  getAttribute(&local_88,(string *)this_04,SUB81(local_c8,0));
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  local_c8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"/UserUnit","");
  getAttribute((QPDFPageObjectHelper *)&local_40,(string *)this_04,SUB81(local_c8,0));
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  if (in_DL != '\0') {
    bVar3 = QPDFObjectHandle::isNull((QPDFObjectHandle *)&local_88);
    if (bVar3) {
      bVar3 = QPDFObjectHandle::isNull(&local_40);
      if (bVar3) goto LAB_001d77b6;
    }
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"/Matrix","");
    getMatrixForTransformations((Matrix *)local_c8,this_04,false);
    QPDFObjectHandle::newArray(&local_50,(Matrix *)local_c8);
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)
               &local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (string *)local_e8,&local_50);
    if (local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((element_type *)local_e8._0_8_ != (element_type *)(local_e8 + 0x10)) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
  }
LAB_001d77b6:
  if ((element_type *)
      local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
  _Var4._M_pi = extraout_RDX;
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
    _Var4._M_pi = extraout_RDX_00;
  }
  if (local_88.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_88.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    _Var4._M_pi = extraout_RDX_01;
  }
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_01._M_pi;
  return (QPDFObjectHandle)
         QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFPageObjectHelper::getFormXObjectForPage(bool handle_transformations)
{
    auto result =
        oh().getQPDF("QPDFPageObjectHelper::getFormXObjectForPage called with a direct object")
            .newStream();
    QPDFObjectHandle newdict = result.getDict();
    newdict.replaceKey("/Type", QPDFObjectHandle::newName("/XObject"));
    newdict.replaceKey("/Subtype", QPDFObjectHandle::newName("/Form"));
    newdict.replaceKey("/Resources", getAttribute("/Resources", false).shallowCopy());
    newdict.replaceKey("/Group", getAttribute("/Group", false).shallowCopy());
    QPDFObjectHandle bbox = getTrimBox(false).shallowCopy();
    if (!bbox.isRectangle()) {
        oh().warnIfPossible(
            "bounding box is invalid; form XObject created from page will not work");
    }
    newdict.replaceKey("/BBox", bbox);
    auto provider =
        std::shared_ptr<QPDFObjectHandle::StreamDataProvider>(new ContentProvider(oh()));
    result.replaceStreamData(provider, QPDFObjectHandle::newNull(), QPDFObjectHandle::newNull());
    QPDFObjectHandle rotate_obj = getAttribute("/Rotate", false);
    QPDFObjectHandle scale_obj = getAttribute("/UserUnit", false);
    if (handle_transformations && (!(rotate_obj.isNull() && scale_obj.isNull()))) {
        newdict.replaceKey("/Matrix", QPDFObjectHandle::newArray(getMatrixForTransformations()));
    }

    return result;
}